

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O1

void __thiscall
skiplist_tests::findearliestatleast_test::test_method(findearliestatleast_test *this)

{
  undefined8 *puVar1;
  uint uVar2;
  void *__s;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int64_t iVar6;
  uint64_t uVar7;
  CBlockIndex *pCVar8;
  CBlockIndex *pCVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  uint32_t uVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  CChain chain;
  void *pvVar19;
  int local_170;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 local_78 [20];
  uint32_t uStack_64;
  uint32_t auStack_60 [2];
  undefined1 local_58 [24];
  char **ppcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = operator_new(3200000);
  memset(__s,0,3200000);
  pvVar3 = operator_new(15200000);
  uVar16 = 0;
  memset(pvVar3,0,15200000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  do {
    uVar15 = (uint32_t)uVar16;
    uStack_64 = 0;
    auStack_60[0] = 0;
    auStack_60[1] = 0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    local_78._0_4_ = uVar15;
    ArithToUint256((uint256 *)local_58,(arith_uint256 *)local_78);
    lVar4 = uVar16 * 0x20;
    puVar1 = (undefined8 *)((long)__s + lVar4 + 0x10);
    *puVar1 = local_58._16_8_;
    puVar1[1] = ppcStack_40;
    *(undefined8 *)((long)__s + lVar4) = local_58._0_8_;
    ((undefined8 *)((long)__s + lVar4))[1] = CONCAT71(local_58._9_7_,local_58[8]);
    lVar5 = uVar16 * 0x98;
    pCVar8 = (CBlockIndex *)((long)pvVar3 + lVar5);
    *(uint32_t *)((long)pvVar3 + lVar5 + 0x18) = uVar15;
    pvVar10 = (void *)((ulong)(uVar15 - 1) * 0x98 + (long)pvVar3);
    if (uVar16 == 0) {
      pvVar10 = (void *)0x0;
    }
    *(void **)((long)pvVar3 + lVar5 + 8) = pvVar10;
    *(void **)((long)pvVar3 + lVar5) = (void *)((long)__s + lVar4);
    CBlockIndex::BuildSkip(pCVar8);
    if (uVar16 < 10) {
      pCVar8->nTime = uVar15;
      pCVar8->nTimeMax = uVar15;
    }
    else {
      iVar6 = CBlockIndex::GetMedianTimePast(pCVar8);
      uVar12 = iVar6 - 1;
      if (uVar12 == 0) {
        uVar2 = 0x40;
      }
      else {
        lVar4 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar2 = (uint)lVar4 ^ 0x3f;
      }
      do {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar2);
      } while (uVar12 < uVar7);
      local_170 = (int)iVar6;
      uVar18 = (int)uVar7 + local_170;
      pCVar8->nTime = uVar18;
      uVar2 = *(uint *)((long)pvVar3 + (ulong)(uVar15 - 1) * 0x98 + 0x90);
      if (uVar18 < uVar2) {
        uVar18 = uVar2;
      }
      pCVar8->nTimeMax = uVar18;
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 100000);
  pcVar17 = (char *)0x90;
  uVar2 = 0;
  pvVar10 = pvVar3;
  do {
    uVar18 = *(uint *)((long)pvVar3 + (long)(pcVar17 + -0x10));
    if (*(uint *)((long)pvVar3 + (long)(pcVar17 + -0x10)) < uVar2) {
      uVar18 = uVar2;
    }
    uVar2 = uVar18;
    local_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_80 = "";
    local_98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x7f;
    file.m_begin = (iterator)&local_88;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
    local_78[0] = uVar2 == *(uint *)((long)pvVar3 + (long)pcVar17);
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    uStack_64 = 0;
    local_e0._0_8_ = "curTimeMax == vBlocksMain[i].nTimeMax";
    local_e0.m_message.px = (element_type *)0xf6a2a7;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = (char **)&local_e0;
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_a0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,(check_type)pvVar10,
               (size_t)&local_a8,0x7f);
    boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 0x10));
    pcVar17 = pcVar17 + 0x98;
  } while (pcVar17 != "addr5, NODE_NONE))");
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = 0;
  uStack_64 = 0;
  pvVar3 = pvVar10;
  CChain::SetTip((CChain *)local_78,(CBlockIndex *)((long)pvVar10 + 0xe7ee68));
  iVar11 = 0;
  do {
    do {
      pvVar19 = pvVar3;
      uVar7 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0x11);
      pvVar3 = pvVar19;
    } while (99999 < uVar7);
    lVar4 = (long)(int)uVar7 * 0x98;
    uVar2 = *(uint *)((long)pvVar10 + lVar4 + 0x80);
    pCVar8 = CChain::FindEarliestAtLeast((CChain *)local_78,(ulong)uVar2,0);
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x8c;
    file_00.m_begin = (iterator)&local_b8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,
               msg_00);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_f0 = "ret->nTimeMax >= test_time";
    local_e8 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_f0;
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_f8 = "";
    pvVar13 = (iterator)0x1;
    pvVar14 = (iterator)0x0;
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(uVar2 <= pCVar8->nTimeMax);
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_58,1,0,WARN,(check_type)pvVar19,(size_t)&local_100,
               0x8c);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_108 = "";
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x8d;
    file_01.m_begin = (iterator)&local_110;
    msg_01.m_end = pvVar14;
    msg_01.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_120,
               msg_01);
    if (pCVar8->pprev == (CBlockIndex *)0x0) {
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(pCVar8->pprev->nTimeMax < uVar2);
    }
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_f0 = "(ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time";
    local_e8 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_f0;
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_128 = "";
    pvVar13 = (iterator)0x1;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_58,1,0,WARN,(check_type)pvVar19,(size_t)&local_130,
               0x8d);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x8e;
    file_02.m_begin = (iterator)&local_140;
    msg_02.m_end = pvVar14;
    msg_02.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_150,
               msg_02);
    pvVar3 = pvVar19;
    pCVar9 = CBlockIndex::GetAncestor((CBlockIndex *)(lVar4 + (long)pvVar19),pCVar8->nHeight);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(pCVar9 == pCVar8);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_f0 = "vBlocksMain[r].GetAncestor(ret->nHeight) == ret";
    local_e8 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_f0;
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_158 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_58,1,0,WARN,(check_type)pvVar3,(size_t)&local_160,
               0x8e);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    iVar11 = iVar11 + 1;
    pvVar10 = pvVar19;
  } while (iVar11 != 10000);
  pvVar3 = (void *)CONCAT44(local_78._4_4_,local_78._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,CONCAT44(uStack_64,local_78._16_4_) - (long)pvVar3);
  }
  operator_delete(pvVar19,15200000);
  operator_delete(__s,3200000);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_test)
{
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        if (i < 10) {
            vBlocksMain[i].nTime = i;
            vBlocksMain[i].nTimeMax = i;
        } else {
            // randomly choose something in the range [MTP, MTP*2]
            int64_t medianTimePast = vBlocksMain[i].GetMedianTimePast();
            int r{int(m_rng.randrange(medianTimePast))};
            vBlocksMain[i].nTime = uint32_t(r + medianTimePast);
            vBlocksMain[i].nTimeMax = std::max(vBlocksMain[i].nTime, vBlocksMain[i-1].nTimeMax);
        }
    }
    // Check that we set nTimeMax up correctly.
    unsigned int curTimeMax = 0;
    for (unsigned int i=0; i<vBlocksMain.size(); ++i) {
        curTimeMax = std::max(curTimeMax, vBlocksMain[i].nTime);
        BOOST_CHECK(curTimeMax == vBlocksMain[i].nTimeMax);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Verify that FindEarliestAtLeast is correct.
    for (unsigned int i=0; i<10000; ++i) {
        // Pick a random element in vBlocksMain.
        int r = m_rng.randrange(vBlocksMain.size());
        int64_t test_time = vBlocksMain[r].nTime;
        CBlockIndex* ret = chain.FindEarliestAtLeast(test_time, 0);
        BOOST_CHECK(ret->nTimeMax >= test_time);
        BOOST_CHECK((ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time);
        BOOST_CHECK(vBlocksMain[r].GetAncestor(ret->nHeight) == ret);
    }
}